

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompOpEvalPredicate
               (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodeSetPtr set,int minPos,
               int maxPos,int hasNsNodes)

{
  int *piVar1;
  int iVar2;
  xmlXPathStepOp *pxVar3;
  long lVar4;
  int iStack_40;
  
  lVar4 = (long)op->ch1;
  if (lVar4 == -1) {
LAB_001b97be:
    if (op->ch2 == -1) {
      return;
    }
    xmlXPathNodeSetFilter(ctxt,set,op->ch2,minPos,maxPos,hasNsNodes);
    return;
  }
  pxVar3 = ctxt->comp->steps;
  if (pxVar3[lVar4].op == XPATH_OP_PREDICATE) {
    iVar2 = ctxt->context->depth;
    if (iVar2 < 5000) {
      ctxt->context->depth = iVar2 + 1;
      xmlXPathCompOpEvalPredicate(ctxt,pxVar3 + lVar4,set,1,set->nodeNr,hasNsNodes);
      piVar1 = &ctxt->context->depth;
      *piVar1 = *piVar1 + -1;
      if (ctxt->error != 0) {
        return;
      }
      goto LAB_001b97be;
    }
    iStack_40 = 0x1a;
  }
  else {
    iStack_40 = 10;
  }
  xmlXPathErr(ctxt,iStack_40);
  return;
}

Assistant:

static void
xmlXPathCompOpEvalPredicate(xmlXPathParserContextPtr ctxt,
			    xmlXPathStepOpPtr op,
			    xmlNodeSetPtr set,
                            int minPos, int maxPos,
			    int hasNsNodes)
{
    if (op->ch1 != -1) {
	xmlXPathCompExprPtr comp = ctxt->comp;
	/*
	* Process inner predicates first.
	*/
	if (comp->steps[op->ch1].op != XPATH_OP_PREDICATE) {
            XP_ERROR(XPATH_INVALID_OPERAND);
	}
        if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
            XP_ERROR(XPATH_RECURSION_LIMIT_EXCEEDED);
        ctxt->context->depth += 1;
	xmlXPathCompOpEvalPredicate(ctxt, &comp->steps[op->ch1], set,
                                    1, set->nodeNr, hasNsNodes);
        ctxt->context->depth -= 1;
	CHECK_ERROR;
    }

    if (op->ch2 != -1)
        xmlXPathNodeSetFilter(ctxt, set, op->ch2, minPos, maxPos, hasNsNodes);
}